

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::MergeScenes
               (aiScene **_dest,aiScene *master,
               vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *srcList,
               uint flags)

{
  _Rb_tree_header *p_Var1;
  pointer pAVar2;
  aiMaterialProperty *paVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  aiScene *paVar8;
  pointer pSVar9;
  aiTexture **_dest_00;
  aiMaterial **_dest_01;
  aiMesh **_dest_02;
  pointer pSVar10;
  aiMesh *paVar11;
  aiLight **_dest_03;
  aiAnimation **_dest_04;
  aiScene *paVar12;
  aiAnimation *paVar13;
  Logger *this;
  byte bVar14;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *hashes;
  char *pcVar15;
  uint a;
  ulong uVar16;
  pointer pSVar17;
  aiLight *name;
  aiCamera *name_00;
  uint i;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  aiNode *src_00;
  pointer pNVar21;
  ulong uVar22;
  uint i_2;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> src;
  aiCamera **local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> duplicates;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offset;
  vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> nodes;
  aiNode *node;
  undefined1 local_1a8 [16];
  bool local_198;
  ulong local_190;
  uint local_180;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_178 [6];
  
  if (_dest != (aiScene **)0x0) {
    paVar8 = *_dest;
    if ((srcList->
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)._M_impl
        .super__Vector_impl_data._M_start ==
        (srcList->
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      if (paVar8 != (aiScene *)0x0) {
        CopySceneFlat(_dest,master);
        return;
      }
      *_dest = master;
    }
    else {
      if (paVar8 == (aiScene *)0x0) {
        paVar8 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(paVar8);
        *_dest = paVar8;
      }
      else {
        aiScene::~aiScene(paVar8);
        aiScene::aiScene(*_dest);
        paVar8 = *_dest;
      }
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::vector
                (&src,((long)(srcList->
                             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(srcList->
                             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4) + 1,
                 (allocator_type *)local_1a8);
      (src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
       super__Vector_impl_data._M_start)->scene = master;
      p_Var1 = &local_178[0]._M_impl.super__Rb_tree_header;
      uVar18 = 1;
      while( true ) {
        pAVar2 = (srcList->
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(srcList->
                          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4) <=
            (ulong)(uVar18 - 1)) break;
        local_1a8._0_8_ = pAVar2[uVar18 - 1].scene;
        local_180 = 0;
        local_178[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_178[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_178[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
        local_178[0]._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_178[0]._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        SceneHelper::operator=
                  (src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar18,(SceneHelper *)local_1a8);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(local_178);
        uVar18 = uVar18 + 1;
      }
      local_1a8._0_4_ = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&duplicates,
                 ((long)src.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)src.
                       super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x60,
                 (value_type_conflict3 *)local_1a8,(allocator_type *)&node);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&offset,((long)src.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)src.
                               super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x60,
                 (allocator_type *)local_1a8);
      uVar22 = 0;
      while (uVar18 = (uint)uVar22,
            uVar22 < (ulong)(((long)src.
                                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)src.
                                   super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x60)) {
        uVar16 = uVar22;
        if (duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar22] == uVar18 ||
            duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar22] == 0xffffffff) {
          do {
            duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16] = uVar18;
            do {
              uVar16 = (ulong)((int)uVar16 + 1);
              if ((ulong)(((long)src.
                                 super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)src.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x60) <= uVar16)
              goto LAB_0059d808;
            } while (src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar22].scene !=
                     src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16].scene);
          } while( true );
        }
LAB_0059d808:
        uVar22 = (ulong)(uVar18 + 1);
      }
      if ((flags & 1) != 0) {
        for (uVar22 = 1;
            uVar22 < (ulong)(((long)src.
                                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)src.
                                   super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x60);
            uVar22 = (ulong)((int)uVar22 + 1)) {
          uVar18 = snprintf(src.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar22].id,0x20,"$%.6X$_",
                            uVar22);
          src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22].idlen = uVar18;
          if ((flags & 0x10) != 0) {
            AddNodeHashes((SceneCombiner *)
                          (src.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22].scene)->mRootNode,
                          (aiNode *)
                          &src.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22].hashes,hashes);
            for (uVar16 = 0;
                uVar16 < (src.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar22].scene)->mNumAnimations;
                uVar16 = uVar16 + 1) {
              paVar13 = (src.
                         super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar22].scene)->mAnimations
                        [uVar16];
              pSVar17 = src.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar22;
              uVar5 = SuperFastHash((paVar13->mName).data,(paVar13->mName).length,0);
              local_1a8._0_4_ = uVar5;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::_M_insert_unique<unsigned_int>(&(pSVar17->hashes)._M_t,(uint *)local_1a8);
            }
          }
        }
      }
      pSVar10 = src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar17 = src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (uVar18 = 0; uVar22 = (ulong)uVar18,
          uVar22 < (ulong)(((long)src.
                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)src.
                                 super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x60);
          uVar18 = uVar18 + 1) {
        pSVar9 = src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar22;
        if (((flags & 4) != 0) ||
           (uVar18 == duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar22])) {
          paVar8->mNumTextures = paVar8->mNumTextures + pSVar9->scene->mNumTextures;
          paVar8->mNumMaterials = paVar8->mNumMaterials + pSVar9->scene->mNumMaterials;
          paVar8->mNumMeshes = paVar8->mNumMeshes + pSVar9->scene->mNumMeshes;
        }
        paVar8->mNumLights = paVar8->mNumLights + pSVar9->scene->mNumLights;
        paVar8->mNumCameras = paVar8->mNumCameras + pSVar9->scene->mNumCameras;
        paVar8->mNumAnimations = paVar8->mNumAnimations + pSVar9->scene->mNumAnimations;
        if ((pSVar9->scene->mFlags & 8) != 0) {
          *(byte *)&paVar8->mFlags = (byte)paVar8->mFlags | 8;
        }
      }
      uVar22 = (ulong)paVar8->mNumMaterials;
      if (paVar8->mNumTextures != 0) {
        _dest_00 = (aiTexture **)operator_new__(uVar22 << 3);
        paVar8->mTextures = _dest_00;
        uVar22 = 0;
        for (uVar18 = 0; uVar16 = (ulong)uVar18,
            uVar16 < (ulong)(((long)pSVar10 - (long)pSVar17) / 0x60); uVar18 = uVar18 + 1) {
          for (uVar19 = 0; paVar12 = pSVar17[uVar16].scene, uVar19 < paVar12->mNumTextures;
              uVar19 = uVar19 + 1) {
            if (uVar18 == duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16]) {
              *_dest_00 = paVar12->mTextures[uVar19];
LAB_0059d9fe:
              _dest_00 = _dest_00 + 1;
            }
            else if ((flags & 4) != 0) {
              Copy(_dest_00,paVar12->mTextures[uVar19]);
              goto LAB_0059d9fe;
            }
          }
          offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] = (uint)uVar22;
          uVar22 = (ulong)((long)_dest_00 - (long)paVar8->mTextures) >> 3;
          pSVar17 = src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar10 = src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar22 = (ulong)paVar8->mNumMaterials;
      }
      if ((int)uVar22 != 0) {
        _dest_01 = (aiMaterial **)operator_new__(uVar22 << 3);
        paVar8->mMaterials = _dest_01;
        uVar22 = 0;
        for (uVar18 = 0; uVar16 = (ulong)uVar18,
            uVar16 < (ulong)(((long)pSVar10 - (long)pSVar17) / 0x60); uVar18 = uVar18 + 1) {
          pSVar10 = pSVar17 + uVar16;
          for (uVar19 = 0; paVar12 = pSVar10->scene, uVar19 < paVar12->mNumMaterials;
              uVar19 = uVar19 + 1) {
            if (uVar18 == duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16]) {
              *_dest_01 = paVar12->mMaterials[uVar19];
LAB_0059dadb:
              if (pSVar10->scene->mNumTextures != paVar8->mNumTextures) {
                for (uVar20 = 0; uVar20 < (*_dest_01)->mNumProperties; uVar20 = uVar20 + 1) {
                  paVar3 = (*_dest_01)->mProperties[uVar20];
                  pcVar15 = (paVar3->mKey).data;
                  iVar6 = strncmp(pcVar15,"$tex.file",9);
                  if (iVar6 == 0) {
                    if (paVar3->mData[4] == '*') {
                      pcVar15 = paVar3->mData + 5;
                      uVar7 = strtoul10(pcVar15,(char **)0x0);
                      ASSIMP_itoa10(pcVar15,0x3ff,
                                    uVar7 + offset.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar16]);
                    }
                  }
                  else {
                    iVar6 = strcmp(pcVar15,"$mat.name");
                    if (((flags & 2) != 0) && (iVar6 == 0)) {
                      PrefixString((aiString *)paVar3->mData,pSVar17[uVar16].id,pSVar10->idlen);
                    }
                  }
                }
              }
              _dest_01 = _dest_01 + 1;
            }
            else if ((flags & 4) != 0) {
              Copy(_dest_01,paVar12->mMaterials[uVar19]);
              goto LAB_0059dadb;
            }
          }
          offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] = (uint)uVar22;
          uVar22 = (ulong)((long)_dest_01 - (long)paVar8->mMaterials) >> 3;
          pSVar17 = src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar10 = src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      if ((ulong)paVar8->mNumMeshes != 0) {
        _dest_02 = (aiMesh **)operator_new__((ulong)paVar8->mNumMeshes << 3);
        paVar8->mMeshes = _dest_02;
        uVar22 = 0;
        for (uVar18 = 0; uVar16 = (ulong)uVar18,
            uVar16 < (ulong)(((long)pSVar10 - (long)pSVar17) / 0x60); uVar18 = uVar18 + 1) {
          for (uVar19 = 0; paVar12 = pSVar17[uVar16].scene, uVar19 < paVar12->mNumMeshes;
              uVar19 = uVar19 + 1) {
            if (uVar18 == duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16]) {
              paVar11 = paVar12->mMeshes[uVar19];
              *_dest_02 = paVar11;
LAB_0059dc5c:
              paVar11->mMaterialIndex =
                   paVar11->mMaterialIndex +
                   offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16];
              _dest_02 = _dest_02 + 1;
            }
            else if ((flags & 4) != 0) {
              Copy(_dest_02,paVar12->mMeshes[uVar19]);
              paVar11 = *_dest_02;
              goto LAB_0059dc5c;
            }
          }
          offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] = (uint)uVar22;
          uVar22 = (ulong)((long)_dest_02 - (long)paVar8->mMeshes) >> 3;
          pSVar10 = src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pSVar17 = src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
      nodes.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      nodes.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nodes.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::reserve
                (&nodes,(long)(srcList->
                              super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(srcList->
                              super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4);
      if ((ulong)paVar8->mNumLights == 0) {
        _dest_03 = (aiLight **)0x0;
      }
      else {
        _dest_03 = (aiLight **)operator_new__((ulong)paVar8->mNumLights << 3);
      }
      paVar8->mLights = _dest_03;
      if ((ulong)paVar8->mNumCameras == 0) {
        local_258 = (aiCamera **)0x0;
      }
      else {
        local_258 = (aiCamera **)operator_new__((ulong)paVar8->mNumCameras << 3);
      }
      paVar8->mCameras = local_258;
      if ((ulong)paVar8->mNumAnimations == 0) {
        _dest_04 = (aiAnimation **)0x0;
      }
      else {
        _dest_04 = (aiAnimation **)operator_new__((ulong)paVar8->mNumAnimations << 3);
      }
      paVar8->mAnimations = _dest_04;
      uVar22 = ((long)src.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x60 & 0xffffffff;
      while( true ) {
        pSVar17 = src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar16 = uVar22 - 1;
        uVar18 = (uint)uVar16;
        if ((int)uVar18 < 0) break;
        uVar19 = (ulong)(uVar18 & 0x7fffffff);
        src_00 = (src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar19].scene)->mRootNode;
        if (duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] == uVar18) {
          uVar7 = offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19];
          node = src_00;
LAB_0059ddec:
          OffsetNodeMeshIndices(src_00,uVar7);
        }
        else {
          Copy(&node,src_00);
          src_00 = node;
          OffsetNodeMeshIndices
                    (node,offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [duplicates.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar19]]);
          if ((flags & 4) != 0) {
            uVar7 = offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar19] -
                    offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar19]];
            goto LAB_0059ddec;
          }
        }
        if (uVar18 != 0) {
          local_1a8._8_8_ =
               (srcList->
               super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
               _M_impl.super__Vector_impl_data._M_start[(int)uVar22 - 2].attachToNode;
          local_198 = false;
          local_1a8._0_8_ = src_00;
          local_190 = uVar19;
          std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::
          emplace_back<Assimp::NodeAttachmentInfo>(&nodes,(NodeAttachmentInfo *)local_1a8);
        }
        pSVar17 = pSVar17 + uVar19;
        if ((flags & 1) != 0) {
          pcVar15 = pSVar17->id;
          if ((flags & 0x10) == 0) {
            AddNodePrefixes(src_00,pcVar15,pSVar17->idlen);
          }
          else {
            AddNodePrefixesChecked(src_00,pcVar15,pSVar17->idlen,&src,uVar18);
          }
          for (uVar22 = 0; uVar22 < pSVar17->scene->mNumMeshes; uVar22 = uVar22 + 1) {
            paVar11 = pSVar17->scene->mMeshes[uVar22];
            for (uVar20 = 0; uVar20 < paVar11->mNumBones; uVar20 = uVar20 + 1) {
              if (((flags & 0x10) == 0) ||
                 (bVar4 = FindNameMatch(&paVar11->mBones[uVar20]->mName,&src,uVar18), bVar4)) {
                PrefixString(&paVar11->mBones[uVar20]->mName,pcVar15,pSVar17->idlen);
              }
            }
          }
        }
        pcVar15 = pSVar17->id;
        for (uVar22 = 0; paVar12 = pSVar17->scene, uVar22 < paVar12->mNumLights; uVar22 = uVar22 + 1
            ) {
          if (duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19] == uVar18) {
            *_dest_03 = paVar12->mLights[uVar22];
          }
          else {
            Copy(_dest_03,paVar12->mLights[uVar22]);
          }
          if ((flags & 1) != 0) {
            name = *_dest_03;
            if ((flags & 0x10) != 0) {
              bVar4 = FindNameMatch(&name->mName,&src,uVar18);
              if (!bVar4) goto LAB_0059dec1;
              name = *_dest_03;
            }
            PrefixString(&name->mName,pcVar15,pSVar17->idlen);
          }
LAB_0059dec1:
          _dest_03 = _dest_03 + 1;
        }
        for (uVar22 = 0; uVar22 < paVar12->mNumCameras; uVar22 = uVar22 + 1) {
          if (duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19] == uVar18) {
            *local_258 = paVar12->mCameras[uVar22];
          }
          else {
            Copy(local_258,paVar12->mCameras[uVar22]);
          }
          if ((flags & 1) != 0) {
            name_00 = *local_258;
            if ((flags & 0x10) != 0) {
              bVar4 = FindNameMatch(&name_00->mName,&src,uVar18);
              if (!bVar4) goto LAB_0059df3a;
              name_00 = *local_258;
            }
            PrefixString(&name_00->mName,pcVar15,pSVar17->idlen);
          }
LAB_0059df3a:
          local_258 = local_258 + 1;
          paVar12 = pSVar17->scene;
        }
        for (uVar20 = 0; uVar22 = uVar16, uVar20 < paVar12->mNumAnimations; uVar20 = uVar20 + 1) {
          if (duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19] == uVar18) {
            *_dest_04 = paVar12->mAnimations[uVar20];
          }
          else {
            Copy(_dest_04,paVar12->mAnimations[uVar20]);
          }
          if ((flags & 1) != 0) {
            paVar13 = *_dest_04;
            if ((flags & 0x10) != 0) {
              bVar4 = FindNameMatch(&paVar13->mName,&src,uVar18);
              if (!bVar4) goto LAB_0059df88;
              paVar13 = *_dest_04;
            }
            PrefixString(&paVar13->mName,pcVar15,pSVar17->idlen);
            for (uVar22 = 0; paVar13 = *_dest_04, uVar22 < paVar13->mNumChannels;
                uVar22 = uVar22 + 1) {
              if ((flags & 0x10) == 0) {
LAB_0059dff8:
                PrefixString(&paVar13->mChannels[uVar22]->mNodeName,pcVar15,pSVar17->idlen);
              }
              else {
                bVar4 = FindNameMatch(&paVar13->mChannels[uVar22]->mNodeName,&src,uVar18);
                if (bVar4) {
                  paVar13 = *_dest_04;
                  goto LAB_0059dff8;
                }
              }
            }
          }
LAB_0059df88:
          _dest_04 = _dest_04 + 1;
          paVar12 = pSVar17->scene;
        }
      }
      AttachToGraph(master,&nodes);
      paVar8->mRootNode = master->mRootNode;
      for (pNVar21 = nodes.
                     super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pNVar21 !=
          nodes.
          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish; pNVar21 = pNVar21 + 1) {
        if (pNVar21->resolved == false) {
          bVar14 = 0;
          if ((flags & 8) != 0) {
            for (uVar18 = 0; uVar22 = (ulong)uVar18,
                uVar22 < (ulong)(((long)src.
                                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)src.
                                       super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x60);
                uVar18 = uVar18 + 1) {
              if (pNVar21->src_idx != uVar22) {
                AttachToGraph(src.
                              super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar22].scene,&nodes);
                bVar14 = pNVar21->resolved;
                if ((bool)bVar14 != false) break;
              }
            }
          }
          if ((bVar14 & 1) == 0) {
            this = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[45]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,(char (*) [45])"SceneCombiner: Failed to resolve attachment ");
            std::operator<<((ostream *)local_1a8,(pNVar21->node->mName).data);
            std::operator<<((ostream *)local_1a8," ");
            std::operator<<((ostream *)local_1a8,(pNVar21->attachToNode->mName).data);
            std::__cxx11::stringbuf::str();
            Logger::error(this,(char *)node);
            std::__cxx11::string::~string((string *)&node);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          }
        }
      }
      for (uVar18 = 0; uVar22 = (ulong)uVar18,
          uVar22 < (ulong)(((long)src.
                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)src.
                                 super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x60);
          uVar18 = uVar18 + 1) {
        if (uVar18 == duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar22]) {
          paVar12 = src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar22].scene;
          if (paVar12->mMeshes != (aiMesh **)0x0) {
            operator_delete__(paVar12->mMeshes);
          }
          paVar12->mMeshes = (aiMesh **)0x0;
          if (paVar12->mCameras != (aiCamera **)0x0) {
            operator_delete__(paVar12->mCameras);
          }
          paVar12->mCameras = (aiCamera **)0x0;
          if (paVar12->mLights != (aiLight **)0x0) {
            operator_delete__(paVar12->mLights);
          }
          paVar12->mLights = (aiLight **)0x0;
          if (paVar12->mMaterials != (aiMaterial **)0x0) {
            operator_delete__(paVar12->mMaterials);
          }
          paVar12->mMaterials = (aiMaterial **)0x0;
          if (paVar12->mAnimations != (aiAnimation **)0x0) {
            operator_delete__(paVar12->mAnimations);
          }
          paVar12->mAnimations = (aiAnimation **)0x0;
          paVar12->mRootNode = (aiNode *)0x0;
          aiScene::~aiScene(paVar12);
          operator_delete(paVar12);
        }
      }
      if ((paVar8->mNumMeshes == 0) || (paVar8->mNumMaterials == 0)) {
        *(byte *)&paVar8->mFlags = (byte)paVar8->mFlags | 1;
      }
      std::_Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::
      ~_Vector_base(&nodes.
                     super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                   );
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::~vector(&src);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeScenes(aiScene** _dest, aiScene* master, std::vector<AttachmentInfo>& srcList, unsigned int flags) {
    if ( nullptr == _dest ) {
        return;
    }

    // if _dest points to NULL allocate a new scene. Otherwise clear the old and reuse it
    if (srcList.empty())    {
        if (*_dest) {
            SceneCombiner::CopySceneFlat(_dest,master);
        }
        else *_dest = master;
        return;
    }
    if (*_dest) {
        (*_dest)->~aiScene();
        new (*_dest) aiScene();
    }
    else *_dest = new aiScene();

    aiScene* dest = *_dest;

    std::vector<SceneHelper> src (srcList.size()+1);
    src[0].scene = master;
    for (unsigned int i = 0; i < srcList.size();++i)    {
        src[i+1] = SceneHelper( srcList[i].scene );
    }

    // this helper array specifies which scenes are duplicates of others
    std::vector<unsigned int> duplicates(src.size(),UINT_MAX);

    // this helper array is used as lookup table several times
    std::vector<unsigned int> offset(src.size());

    // Find duplicate scenes
    for (unsigned int i = 0; i < src.size();++i) {
        if (duplicates[i] != i && duplicates[i] != UINT_MAX) {
            continue;
        }

        duplicates[i] = i;
        for ( unsigned int a = i+1; a < src.size(); ++a)    {
            if (src[i].scene == src[a].scene) {
                duplicates[a] = i;
            }
        }
    }

    // Generate unique names for all named stuff?
    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES)
    {
#if 0
        // Construct a proper random number generator
        boost::mt19937 rng(  );
        boost::uniform_int<> dist(1u,1 << 24u);
        boost::variate_generator<boost::mt19937&, boost::uniform_int<> > rndGen(rng, dist);
#endif
        for (unsigned int i = 1; i < src.size();++i)
        {
            //if (i != duplicates[i])
            //{
            //  // duplicate scenes share the same UID
            //  ::strcpy( src[i].id, src[duplicates[i]].id );
            //  src[i].idlen = src[duplicates[i]].idlen;

            //  continue;
            //}

            src[i].idlen = ai_snprintf(src[i].id, 32, "$%.6X$_",i);

            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {

                // Compute hashes for all identifiers in this scene and store them
                // in a sorted table (for convenience I'm using std::set). We hash
                // just the node and animation channel names, all identifiers except
                // the material names should be caught by doing this.
                AddNodeHashes(src[i]->mRootNode,src[i].hashes);

                for (unsigned int a = 0; a < src[i]->mNumAnimations;++a) {
                    aiAnimation* anim = src[i]->mAnimations[a];
                    src[i].hashes.insert(SuperFastHash(anim->mName.data,static_cast<uint32_t>(anim->mName.length)));
                }
            }
        }
    }

    unsigned int cnt;

    // First find out how large the respective output arrays must be
    for ( unsigned int n = 0; n < src.size();++n )
    {
        SceneHelper* cur = &src[n];

        if (n == duplicates[n] || flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)   {
            dest->mNumTextures   += (*cur)->mNumTextures;
            dest->mNumMaterials  += (*cur)->mNumMaterials;
            dest->mNumMeshes     += (*cur)->mNumMeshes;
        }

        dest->mNumLights     += (*cur)->mNumLights;
        dest->mNumCameras    += (*cur)->mNumCameras;
        dest->mNumAnimations += (*cur)->mNumAnimations;

        // Combine the flags of all scenes
        // We need to process them flag-by-flag here to get correct results
        // dest->mFlags ; //|= (*cur)->mFlags;
        if ((*cur)->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
            dest->mFlags |= AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
        }
    }

    // generate the output texture list + an offset table for all texture indices
    if (dest->mNumTextures)
    {
        aiTexture** pip = dest->mTextures = new aiTexture*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumTextures;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mTextures[i]);

                    else continue;
                }
                else *pip = (*cur)->mTextures[i];
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mTextures);
        }
    }

    // generate the output material list + an offset table for all material indices
    if (dest->mNumMaterials)
    {
        aiMaterial** pip = dest->mMaterials = new aiMaterial*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )  {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMaterials;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mMaterials[i]);

                    else continue;
                }
                else *pip = (*cur)->mMaterials[i];

                if ((*cur)->mNumTextures != dest->mNumTextures)     {
                    // We need to update all texture indices of the mesh. So we need to search for
                    // a material property called '$tex.file'

                    for (unsigned int a = 0; a < (*pip)->mNumProperties;++a)
                    {
                        aiMaterialProperty* prop = (*pip)->mProperties[a];
                        if (!strncmp(prop->mKey.data,"$tex.file",9))
                        {
                            // Check whether this texture is an embedded texture.
                            // In this case the property looks like this: *<n>,
                            // where n is the index of the texture.
                            aiString& s = *((aiString*)prop->mData);
                            if ('*' == s.data[0])   {
                                // Offset the index and write it back ..
                                const unsigned int idx = strtoul10(&s.data[1]) + offset[n];
                                ASSIMP_itoa10(&s.data[1],sizeof(s.data)-1,idx);
                            }
                        }

                        // Need to generate new, unique material names?
                        else if (!::strcmp( prop->mKey.data,"$mat.name" ) && flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES)
                        {
                            aiString* pcSrc = (aiString*) prop->mData;
                            PrefixString(*pcSrc, (*cur).id, (*cur).idlen);
                        }
                    }
                }
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMaterials);
        }
    }

    // generate the output mesh list + again an offset table for all mesh indices
    if (dest->mNumMeshes)
    {
        aiMesh** pip = dest->mMeshes = new aiMesh*[dest->mNumMeshes];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)
            {
                if (n != duplicates[n]) {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip, (*cur)->mMeshes[i]);

                    else continue;
                }
                else *pip = (*cur)->mMeshes[i];

                // update the material index of the mesh
                (*pip)->mMaterialIndex +=  offset[n];
                ++pip;
            }

            // reuse the offset array - store now the mesh offset in it
            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMeshes);
        }
    }

    std::vector <NodeAttachmentInfo> nodes;
    nodes.reserve(srcList.size());

    // ----------------------------------------------------------------------------
    // Now generate the output node graph. We need to make those
    // names in the graph that are referenced by anims or lights
    // or cameras unique. So we add a prefix to them ... $<rand>_
    // We could also use a counter, but using a random value allows us to
    // use just one prefix if we are joining multiple scene hierarchies recursively.
    // Chances are quite good we don't collide, so we try that ...
    // ----------------------------------------------------------------------------

    // Allocate space for light sources, cameras and animations
    aiLight** ppLights = dest->mLights = (dest->mNumLights
        ? new aiLight*[dest->mNumLights] : NULL);

    aiCamera** ppCameras = dest->mCameras = (dest->mNumCameras
        ? new aiCamera*[dest->mNumCameras] : NULL);

    aiAnimation** ppAnims = dest->mAnimations = (dest->mNumAnimations
        ? new aiAnimation*[dest->mNumAnimations] : NULL);

    for ( int n = static_cast<int>(src.size()-1); n >= 0 ;--n ) /* !!! important !!! */
    {
        SceneHelper* cur = &src[n];
        aiNode* node;

        // To offset or not to offset, this is the question
        if (n != (int)duplicates[n])
        {
            // Get full scene-graph copy
            Copy( &node, (*cur)->mRootNode );
            OffsetNodeMeshIndices(node,offset[duplicates[n]]);

            if (flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY) {
                // (note:) they are already 'offseted' by offset[duplicates[n]]
                OffsetNodeMeshIndices(node,offset[n] - offset[duplicates[n]]);
            }
        }
        else // if (n == duplicates[n])
        {
            node = (*cur)->mRootNode;
            OffsetNodeMeshIndices(node,offset[n]);
        }
        if (n) // src[0] is the master node
            nodes.push_back(NodeAttachmentInfo( node,srcList[n-1].attachToNode,n ));

        // add name prefixes?
        if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {

            // or the whole scenegraph
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                AddNodePrefixesChecked(node,(*cur).id,(*cur).idlen,src,n);
            }
            else AddNodePrefixes(node,(*cur).id,(*cur).idlen);

            // meshes
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)    {
                aiMesh* mesh = (*cur)->mMeshes[i];

                // rename all bones
                for (unsigned int a = 0; a < mesh->mNumBones;++a)   {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch(mesh->mBones[a]->mName,src,n))
                            continue;
                    }
                    PrefixString(mesh->mBones[a]->mName,(*cur).id,(*cur).idlen);
                }
            }
        }

        // --------------------------------------------------------------------
        // Copy light sources
        for (unsigned int i = 0; i < (*cur)->mNumLights;++i,++ppLights)
        {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppLights, (*cur)->mLights[i]);
            }
            else *ppLights = (*cur)->mLights[i];


            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppLights)->mName,src,n))
                        continue;
                }

                PrefixString((*ppLights)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy cameras
        for (unsigned int i = 0; i < (*cur)->mNumCameras;++i,++ppCameras)   {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppCameras, (*cur)->mCameras[i]);
            }
            else *ppCameras = (*cur)->mCameras[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppCameras)->mName,src,n))
                        continue;
                }

                PrefixString((*ppCameras)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy animations
        for (unsigned int i = 0; i < (*cur)->mNumAnimations;++i,++ppAnims)  {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppAnims, (*cur)->mAnimations[i]);
            }
            else *ppAnims = (*cur)->mAnimations[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppAnims)->mName,src,n))
                        continue;
                }

                PrefixString((*ppAnims)->mName,(*cur).id,(*cur).idlen);

                // don't forget to update all node animation channels
                for (unsigned int a = 0; a < (*ppAnims)->mNumChannels;++a) {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch((*ppAnims)->mChannels[a]->mNodeName,src,n))
                            continue;
                    }

                    PrefixString((*ppAnims)->mChannels[a]->mNodeName,(*cur).id,(*cur).idlen);
                }
            }
        }
    }

    // Now build the output graph
    AttachToGraph ( master, nodes);
    dest->mRootNode = master->mRootNode;

    // Check whether we succeeded at building the output graph
    for (std::vector <NodeAttachmentInfo> ::iterator it = nodes.begin();
        it != nodes.end(); ++it)
    {
        if (!(*it).resolved) {
            if (flags & AI_INT_MERGE_SCENE_RESOLVE_CROSS_ATTACHMENTS) {
                // search for this attachment point in all other imported scenes, too.
                for ( unsigned int n = 0; n < src.size();++n ) {
                    if (n != (*it).src_idx) {
                        AttachToGraph(src[n].scene,nodes);
                        if ((*it).resolved)
                            break;
                    }
                }
            }
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F( "SceneCombiner: Failed to resolve attachment ", (*it).node->mName.data,
                    " ", (*it).attachToNode->mName.data );
            }
        }
    }

    // now delete all input scenes. Make sure duplicate scenes aren't
    // deleted more than one time
    for ( unsigned int n = 0; n < src.size();++n )  {
        if (n != duplicates[n]) // duplicate scene?
            continue;

        aiScene* deleteMe = src[n].scene;

        // We need to delete the arrays before the destructor is called -
        // we are reusing the array members
        delete[] deleteMe->mMeshes;     deleteMe->mMeshes     = NULL;
        delete[] deleteMe->mCameras;    deleteMe->mCameras    = NULL;
        delete[] deleteMe->mLights;     deleteMe->mLights     = NULL;
        delete[] deleteMe->mMaterials;  deleteMe->mMaterials  = NULL;
        delete[] deleteMe->mAnimations; deleteMe->mAnimations = NULL;

        deleteMe->mRootNode = NULL;

        // Now we can safely delete the scene
        delete deleteMe;
    }

    // Check flags
    if (!dest->mNumMeshes || !dest->mNumMaterials) {
        dest->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    // We're finished
}